

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

void print_title(void)

{
  bool bVar1;
  char *pcVar2;
  char *local_18;
  
  crnlib::console::printf
            (
            "crunch - Advanced DXTn Texture Compressor - https://github.com/FrozenStormInteractive/Crunch2"
            );
  crnlib::console::printf("");
  crnlib::console::printf("Copyright (c) 2010-2016 Richard Geldreich, Jr. and Binomial LLC");
  crnlib::console::printf("Copyright (c) 2020-2021 FrozenStorm Interactive, Yoann Potinet");
  crnlib::console::printf("");
  pcVar2 = crn_get_version();
  bVar1 = crnlib_is_x64();
  if (bVar1) {
    local_18 = "x64";
  }
  else {
    local_18 = "x86";
  }
  crnlib::console::printf
            ("crnlib version %s %s Built %s, %s",pcVar2,local_18,"Apr 26 2025","23:19:35");
  crnlib::console::printf("");
  return;
}

Assistant:

static void print_title()
{
    console::printf("crunch - Advanced DXTn Texture Compressor - https://github.com/FrozenStormInteractive/Crunch2");
    console::printf("");
    console::printf("Copyright (c) 2010-2016 Richard Geldreich, Jr. and Binomial LLC");
    console::printf("Copyright (c) 2020-2021 FrozenStorm Interactive, Yoann Potinet");
    console::printf("");
    console::printf("crnlib version %s %s Built %s, %s", crn_get_version(), crnlib_is_x64() ? "x64" : "x86", __DATE__, __TIME__);
    console::printf("");
}